

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O1

unique_ptr<charls::process_line,_std::default_delete<charls::process_line>_> __thiscall
charls::
jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
::create_process_line
          (jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
           *this,byte_span info,size_t stride)

{
  color_transformation cVar1;
  uint32_t bits_per_pixel;
  bool bVar2;
  process_transformed<charls::transform_hp1<unsigned_char>_> *this_00;
  void *raw_data;
  jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
  *this_01;
  size_t in_R8;
  
  raw_data = (void *)info.size;
  this_01 = (jls_codec<charls::default_traits<unsigned_char,_charls::triplet<unsigned_char>_>,_charls::encoder_strategy>
             *)info.data;
  bVar2 = is_interleaved(this_01);
  if (bVar2) {
    cVar1 = (this_01->super_encoder_strategy).parameters_.transformation;
    if (cVar1 == None) {
      this_00 = (process_transformed<charls::transform_hp1<unsigned_char>_> *)operator_new(0x70);
      process_transformed<charls::transform_none<unsigned_char>_>::process_transformed
                ((process_transformed<charls::transform_none<unsigned_char>_> *)this_00,raw_data,
                 stride);
    }
    else {
      if ((this_01->super_encoder_strategy).frame_info_.bits_per_sample != 8) {
        impl::throw_jpegls_error(bit_depth_for_transform_not_supported);
      }
      if (cVar1 == HP3) {
        this_00 = (process_transformed<charls::transform_hp1<unsigned_char>_> *)operator_new(0x70);
        process_transformed<charls::transform_hp3<unsigned_char>_>::process_transformed
                  ((process_transformed<charls::transform_hp3<unsigned_char>_> *)this_00,raw_data,
                   stride);
      }
      else if (cVar1 == HP2) {
        this_00 = (process_transformed<charls::transform_hp1<unsigned_char>_> *)operator_new(0x70);
        process_transformed<charls::transform_hp2<unsigned_char>_>::process_transformed
                  ((process_transformed<charls::transform_hp2<unsigned_char>_> *)this_00,raw_data,
                   stride);
      }
      else {
        if (cVar1 != HP1) {
          impl::throw_jpegls_error(UnsupportedColorTransform);
        }
        this_00 = (process_transformed<charls::transform_hp1<unsigned_char>_> *)operator_new(0x70);
        process_transformed<charls::transform_hp1<unsigned_char>_>::process_transformed
                  (this_00,raw_data,stride);
      }
    }
  }
  else {
    bits_per_pixel = (this_01->super_encoder_strategy).frame_info_.bits_per_sample;
    if (bits_per_pixel == 8) {
      __assert_fail("bytes_per_pixel == sizeof(uint8_t) || bytes_per_pixel == sizeof(uint16_t)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/process_line.h"
                    ,0x30,
                    "charls::post_process_single_component::post_process_single_component(void *, const size_t, const size_t)"
                   );
    }
    this_00 = (process_transformed<charls::transform_hp1<unsigned_char>_> *)operator_new(0x28);
    post_process_single_component_masked::post_process_single_component_masked
              ((post_process_single_component_masked *)this_00,raw_data,in_R8,3,bits_per_pixel);
  }
  (this->super_encoder_strategy)._vptr_encoder_strategy = (_func_int **)this_00;
  return (__uniq_ptr_data<charls::process_line,_std::default_delete<charls::process_line>,_true,_true>
          )(__uniq_ptr_data<charls::process_line,_std::default_delete<charls::process_line>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<process_line> create_process_line(byte_span info, const size_t stride) override
    {
        if (!is_interleaved())
        {
            if (frame_info().bits_per_sample == sizeof(sample_type) * 8)
            {
                return std::make_unique<post_process_single_component>(info.data, stride,
                                                                       sizeof(typename Traits::pixel_type));
            }

            return std::make_unique<post_process_single_component_masked>(
                info.data, stride, sizeof(typename Traits::pixel_type), frame_info().bits_per_sample);
        }

        if (parameters().transformation == color_transformation::none)
            return std::make_unique<process_transformed<transform_none<typename Traits::sample_type>>>(
                info, stride, frame_info(), parameters(), transform_none<sample_type>());

        if (frame_info().bits_per_sample == sizeof(sample_type) * 8)
        {
            switch (parameters().transformation)
            {
            case color_transformation::hp1:
                return std::make_unique<process_transformed<transform_hp1<sample_type>>>(
                    info, stride, frame_info(), parameters(), transform_hp1<sample_type>());
            case color_transformation::hp2:
                return std::make_unique<process_transformed<transform_hp2<sample_type>>>(
                    info, stride, frame_info(), parameters(), transform_hp2<sample_type>());
            case color_transformation::hp3:
                return std::make_unique<process_transformed<transform_hp3<sample_type>>>(
                    info, stride, frame_info(), parameters(), transform_hp3<sample_type>());
            default:
                impl::throw_jpegls_error(jpegls_errc::color_transform_not_supported);
            }
        }

        impl::throw_jpegls_error(jpegls_errc::bit_depth_for_transform_not_supported);
    }